

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_count(archive_acl *acl,wchar_t want_type)

{
  wchar_t wVar1;
  archive_acl_entry *paVar2;
  wchar_t wVar3;
  
  wVar3 = L'\0';
  for (paVar2 = acl->acl_head; paVar2 != (archive_acl_entry *)0x0; paVar2 = paVar2->next) {
    wVar3 = (wVar3 + L'\x01') - (uint)((paVar2->type & want_type) == 0);
  }
  wVar1 = wVar3 + L'\x03';
  if (wVar3 == L'\0') {
    wVar1 = wVar3;
  }
  if (((uint)want_type >> 8 & 1) == 0) {
    wVar1 = wVar3;
  }
  return wVar1;
}

Assistant:

int
archive_acl_count(struct archive_acl *acl, int want_type)
{
	int count;
	struct archive_acl_entry *ap;

	count = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & want_type) != 0)
			count++;
		ap = ap->next;
	}

	if (count > 0 && ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0))
		count += 3;
	return (count);
}